

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
sjtu::
map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
::erase(map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
        *this,Node *x)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  color_type cVar4;
  Node *pNVar5;
  
  cVar4 = x->color;
  pNVar2 = x->left;
  pNVar5 = x->right;
  if (pNVar2 == this->nil) {
    pNVar1 = x->parent;
    (&pNVar1->left)[pNVar1->left != x] = pNVar5;
    pNVar2 = pNVar5;
  }
  else if (pNVar5 == this->nil) {
    pNVar1 = x->parent;
    (&pNVar1->left)[pNVar1->left != x] = pNVar2;
    pNVar5 = pNVar2;
  }
  else {
    pNVar1 = findmin(this,pNVar5);
    cVar4 = pNVar1->color;
    pNVar2 = pNVar1->right;
    pNVar5 = pNVar1->parent;
    pNVar3 = pNVar2;
    if (pNVar5 != x) {
      (&pNVar5->left)[pNVar5->left != pNVar1] = pNVar2;
      pNVar2->parent = pNVar5;
      pNVar3 = x->right;
      pNVar1->right = pNVar3;
    }
    pNVar3->parent = pNVar1;
    pNVar5 = x->parent;
    (&pNVar5->left)[pNVar5->left != x] = pNVar1;
    pNVar1->parent = pNVar5;
    pNVar1->color = x->color;
    pNVar5 = x->left;
    pNVar1->left = pNVar5;
  }
  pNVar5->parent = pNVar1;
  Node::~Node(x);
  operator_delete(x,0x28);
  this->tot = this->tot - 1;
  if (cVar4 == BLACK) {
    erase_fixup(this,pNVar2);
    pNVar2 = this->nil;
    pNVar2->parent = pNVar2;
  }
  else {
    pNVar2 = this->nil;
  }
  pNVar2 = findmin(this,pNVar2);
  this->nodebegin = pNVar2;
  return;
}

Assistant:

void erase(Node *x)
	{
		color_type col = x -> color;Node *y;
		if (x -> left == nil) y = x -> right , transplant(x , x -> right);
		else if (x -> right == nil) y = x -> left , transplant(x , x -> left);
		else
		{
			Node *z = findmin(x -> right);col = z -> color , y = z -> right;
			if (z -> parent == x) z -> right -> parent = z;//assure that nil -> parent = z
			else
			{
				transplant(z , z -> right);
				z -> right = x -> right , z -> right -> parent = z;
			}
			transplant(x , z);
			z -> color = x -> color , z -> left = x -> left , z -> left -> parent = z;
		}
		delete x , -- tot;
		if (col == BLACK) erase_fixup(y) , nil -> parent = nil;
		nodebegin = findmin(nil);
	}